

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O1

ArgEscapeData * findArgEscapes(ArgEscapeData *__return_storage_ptr__,QStringView s)

{
  storage_type_conflict *psVar1;
  storage_type_conflict *psVar2;
  storage_type_conflict sVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  storage_type_conflict *psVar7;
  qsizetype qVar8;
  qsizetype qVar9;
  storage_type_conflict *psVar10;
  storage_type_conflict *psVar11;
  int iVar12;
  int iVar13;
  bool bVar14;
  
  psVar7 = s.m_data;
  psVar2 = psVar7 + s.m_size;
  *(undefined1 **)__return_storage_ptr__ = &DAT_aaaaaaaaaaaaaaaa;
  __return_storage_ptr__->occurrences = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  __return_storage_ptr__->locale_occurrences = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  __return_storage_ptr__->escape_len = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  __return_storage_ptr__->min_escape = 0x7fffffff;
  __return_storage_ptr__->occurrences = 0;
  __return_storage_ptr__->locale_occurrences = 0;
  __return_storage_ptr__->escape_len = 0;
  iVar6 = 0x7fffffff;
  lVar5 = 0;
  qVar8 = 0;
  qVar9 = 0;
  while (psVar7 != psVar2) {
    if (*psVar7 == L'%') {
      bVar14 = false;
    }
    else {
      do {
        psVar7 = psVar7 + 1;
        bVar14 = psVar7 == psVar2;
        if (bVar14) goto LAB_00160455;
      } while (*psVar7 != L'%');
    }
    if (bVar14) break;
    psVar10 = psVar7 + 1;
    bVar14 = true;
    if ((psVar10 != psVar2) &&
       ((sVar3 = *psVar10, sVar3 != L'L' || (psVar10 = psVar7 + 2, psVar10 != psVar2)))) {
      iVar12 = (ushort)*psVar10 - 0x30;
      psVar11 = psVar10;
      if (iVar12 != -1 && 0xfff5 < (ushort)(*psVar10 + L'ￆ')) {
        psVar1 = psVar10 + 1;
        psVar11 = psVar1;
        iVar13 = iVar12;
        if (psVar1 != psVar2) {
          iVar4 = (ushort)psVar10[1] - 0x30;
          if (9 < (ushort)((ushort)psVar10[1] - 0x30)) {
            iVar4 = -1;
          }
          psVar11 = psVar10 + 2;
          iVar13 = iVar4 + iVar12 * 10;
          if (iVar4 == -1) {
            psVar11 = psVar1;
            iVar13 = iVar12;
          }
        }
        if (iVar13 <= iVar6) {
          if (iVar13 < iVar6) {
            lVar5 = 0;
            qVar8 = 0;
            qVar9 = 0;
            iVar6 = iVar13;
          }
          qVar9 = qVar9 + 1;
          lVar5 = lVar5 + (ulong)(sVar3 == L'L');
          qVar8 = qVar8 + ((long)psVar11 - (long)psVar7 >> 1);
        }
      }
      bVar14 = false;
      psVar10 = psVar11;
    }
    psVar7 = psVar10;
    if (bVar14) break;
  }
LAB_00160455:
  __return_storage_ptr__->min_escape = iVar6;
  __return_storage_ptr__->occurrences = qVar9;
  __return_storage_ptr__->escape_len = qVar8;
  __return_storage_ptr__->locale_occurrences = lVar5;
  return __return_storage_ptr__;
}

Assistant:

static ArgEscapeData findArgEscapes(QStringView s)
{
    const QChar *uc_begin = s.begin();
    const QChar *uc_end = s.end();

    ArgEscapeData d;

    d.min_escape = INT_MAX;
    d.occurrences = 0;
    d.escape_len = 0;
    d.locale_occurrences = 0;

    const QChar *c = uc_begin;
    while (c != uc_end) {
        while (c != uc_end && c->unicode() != '%')
            ++c;

        if (c == uc_end)
            break;
        const QChar *escape_start = c;
        if (++c == uc_end)
            break;

        bool locale_arg = false;
        if (c->unicode() == 'L') {
            locale_arg = true;
            if (++c == uc_end)
                break;
        }

        int escape = qArgDigitValue(*c);
        if (escape == -1)
            continue;

        // ### Qt 7: do not allow anything but ASCII digits
        // in arg()'s replacements.
#if QT_VERSION <= QT_VERSION_CHECK(7, 0, 0) && !defined(QT_BOOTSTRAPPED)
        const QChar *escapeBegin = c;
        const QChar *escapeEnd = escapeBegin + 1;
#endif

        ++c;

        if (c != uc_end) {
            const int next_escape = qArgDigitValue(*c);
            if (next_escape != -1) {
                escape = (10 * escape) + next_escape;
                ++c;
#if QT_VERSION <= QT_VERSION_CHECK(7, 0, 0) && !defined(QT_BOOTSTRAPPED)
                ++escapeEnd;
#endif
            }
        }

#if QT_VERSION <= QT_VERSION_CHECK(7, 0, 0) && !defined(QT_BOOTSTRAPPED)
        checkArgEscape(QStringView(escapeBegin, escapeEnd));
#endif

        if (escape > d.min_escape)
            continue;

        if (escape < d.min_escape) {
            d.min_escape = escape;
            d.occurrences = 0;
            d.escape_len = 0;
            d.locale_occurrences = 0;
        }

        ++d.occurrences;
        if (locale_arg)
            ++d.locale_occurrences;
        d.escape_len += c - escape_start;
    }
    return d;
}